

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testInit
          (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *this)

{
  TYPES TVar1;
  GLuint GVar2;
  undefined8 uVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  Type TVar8;
  undefined1 local_318 [8];
  testCase test_case_fs_sc;
  testCase test_case_fs_cs;
  testCase test_case_fs_sn;
  testCase test_case_fs_ns;
  testCase test_case_fs_cn;
  testCase test_case_fs_nc;
  testCase test_case_tes_pn;
  testCase test_case_tes_np;
  testCase test_case_tcs_pn;
  testCase test_case_tcs_np;
  GLchar *fs_int_goten;
  GLchar *fs_int_gohan;
  GLuint goten;
  GLuint gohan;
  GLuint n_req_components_goten;
  GLuint n_req_components_gohan;
  bool is_float_type_goten;
  bool is_flat_req_goten;
  GLuint GStack_6c;
  bool is_flat_req_gohan;
  GLuint local_68;
  Type local_60;
  Type *local_50;
  Type *type_goten;
  GLuint j;
  GLuint GStack_3c;
  bool is_float_type_gohan;
  GLuint local_38;
  Type local_2c;
  Type *local_20;
  Type *type_gohan;
  GLuint i;
  GLuint n_types;
  VaryingLocationAliasingWithMixedAuxiliaryStorageTest *this_local;
  
  _i = this;
  type_gohan._4_4_ = TestBase::getTypesNumber((TestBase *)this);
  for (type_gohan._0_4_ = 0; (uint)type_gohan < type_gohan._4_4_;
      type_gohan._0_4_ = (uint)type_gohan + 1) {
    TVar8 = TestBase::getType((TestBase *)this,(uint)type_gohan);
    _j = TVar8._0_8_;
    local_2c.m_basic_type = j;
    local_2c.m_n_columns = GStack_3c;
    local_38 = TVar8.m_n_rows;
    local_2c.m_n_rows = local_38;
    local_20 = &local_2c;
    _j = TVar8;
    type_goten._7_1_ = isFloatType(this,local_20);
    if (local_20->m_n_columns == 1) {
      for (type_goten._0_4_ = 0; (uint)type_goten < type_gohan._4_4_;
          type_goten._0_4_ = (uint)type_goten + 1) {
        TVar8 = TestBase::getType((TestBase *)this,(uint)type_goten);
        local_68 = TVar8.m_n_rows;
        local_60.m_n_rows = local_68;
        _n_req_components_gohan = TVar8._0_8_;
        local_60.m_basic_type = n_req_components_gohan;
        local_60.m_n_columns = GStack_6c;
        uVar3 = local_60._0_8_;
        local_50 = &local_60;
        TVar1 = local_20->m_basic_type;
        local_60.m_basic_type = TVar8.m_basic_type;
        bVar7 = local_60.m_basic_type != Float;
        local_60._0_8_ = uVar3;
        bVar4 = isFloatType(this,local_50);
        if (((local_50->m_n_columns == 1) && ((bool)(type_goten._7_1_ & 1) == bVar4)) &&
           (GVar2 = local_20->m_n_rows, GVar2 + local_50->m_n_rows < 5)) {
          pcVar5 = "";
          if (TVar1 != Float) {
            pcVar5 = "flat";
          }
          pcVar6 = "";
          if (bVar7) {
            pcVar6 = "flat";
          }
          test_case_tcs_pn.m_type_goten.m_n_columns = 0;
          test_case_tes_np.m_type_goten.m_n_columns = 0;
          test_case_tcs_pn.m_component_gohan = 1;
          test_case_tcs_pn.m_component_goten = 0;
          test_case_tcs_pn._8_8_ = anon_var_dwarf_3d91;
          test_case_tcs_pn.m_int_gohan = "";
          test_case_tcs_pn.m_int_goten._0_1_ = 0;
          test_case_tcs_pn.m_int_goten._4_4_ = 2;
          test_case_tcs_pn._32_8_ = *(undefined8 *)local_20;
          test_case_tcs_pn.m_type_gohan.m_basic_type = local_20->m_n_rows;
          test_case_tcs_pn.m_type_gohan.m_n_columns = local_50->m_basic_type;
          test_case_tcs_pn.m_type_gohan.m_n_rows = local_50->m_n_columns;
          test_case_tcs_pn.m_type_goten.m_basic_type = local_50->m_n_rows;
          test_case_tes_pn.m_type_goten.m_n_columns = 0;
          test_case_tes_np.m_component_gohan = 0;
          test_case_tes_np.m_component_goten = 1;
          test_case_tes_np._8_8_ = anon_var_dwarf_3d91;
          test_case_tes_np.m_int_gohan = "";
          test_case_tes_np.m_int_goten._0_1_ = 1;
          test_case_tes_np.m_int_goten._4_4_ = 3;
          test_case_tes_np._32_8_ = *(undefined8 *)local_20;
          test_case_tes_np.m_type_gohan.m_basic_type = local_20->m_n_rows;
          test_case_tes_np.m_type_gohan.m_n_columns = local_50->m_basic_type;
          test_case_tes_np.m_type_gohan.m_n_rows = local_50->m_n_columns;
          test_case_tes_np.m_type_goten.m_basic_type = local_50->m_n_rows;
          test_case_fs_nc.m_type_goten.m_n_columns = 0;
          test_case_tes_pn.m_component_gohan = 1;
          test_case_tes_pn.m_component_goten = 0;
          test_case_tes_pn._8_8_ = anon_var_dwarf_3d91;
          test_case_tes_pn.m_int_gohan = "";
          test_case_tes_pn.m_int_goten._0_1_ = 1;
          test_case_tes_pn.m_int_goten._4_4_ = 3;
          test_case_tes_pn._32_8_ = *(undefined8 *)local_20;
          test_case_tes_pn.m_type_gohan.m_basic_type = local_20->m_n_rows;
          test_case_tes_pn.m_type_gohan.m_n_columns = local_50->m_basic_type;
          test_case_tes_pn.m_type_gohan.m_n_rows = local_50->m_n_columns;
          test_case_tes_pn.m_type_goten.m_basic_type = local_50->m_n_rows;
          test_case_fs_cn.m_type_goten.m_n_columns = 0;
          test_case_fs_nc.m_component_gohan = 0;
          test_case_fs_nc.m_component_goten = 2;
          test_case_fs_nc.m_int_goten._0_1_ = 1;
          test_case_fs_nc.m_int_goten._4_4_ = 5;
          test_case_fs_nc._32_8_ = *(undefined8 *)local_20;
          test_case_fs_nc.m_type_gohan.m_basic_type = local_20->m_n_rows;
          test_case_fs_nc.m_type_gohan.m_n_columns = local_50->m_basic_type;
          test_case_fs_nc.m_type_gohan.m_n_rows = local_50->m_n_columns;
          test_case_fs_nc.m_type_goten.m_basic_type = local_50->m_n_rows;
          test_case_fs_ns.m_type_goten.m_n_columns = 0;
          test_case_fs_cn.m_component_gohan = 2;
          test_case_fs_cn.m_component_goten = 0;
          test_case_fs_cn.m_int_goten._0_1_ = 1;
          test_case_fs_cn.m_int_goten._4_4_ = 5;
          test_case_fs_cn._32_8_ = *(undefined8 *)local_20;
          test_case_fs_cn.m_type_gohan.m_basic_type = local_20->m_n_rows;
          test_case_fs_cn.m_type_gohan.m_n_columns = local_50->m_basic_type;
          test_case_fs_cn.m_type_gohan.m_n_rows = local_50->m_n_columns;
          test_case_fs_cn.m_type_goten.m_basic_type = local_50->m_n_rows;
          test_case_fs_sn.m_type_goten.m_n_columns = 0;
          test_case_fs_ns.m_component_gohan = 0;
          test_case_fs_ns.m_component_goten = 3;
          test_case_fs_ns.m_int_goten._0_1_ = 1;
          test_case_fs_ns.m_int_goten._4_4_ = 5;
          test_case_fs_ns._32_8_ = *(undefined8 *)local_20;
          test_case_fs_ns.m_type_gohan.m_basic_type = local_20->m_n_rows;
          test_case_fs_ns.m_type_gohan.m_n_columns = local_50->m_basic_type;
          test_case_fs_ns.m_type_gohan.m_n_rows = local_50->m_n_columns;
          test_case_fs_ns.m_type_goten.m_basic_type = local_50->m_n_rows;
          test_case_fs_cs.m_type_goten.m_n_columns = 0;
          test_case_fs_sn.m_component_gohan = 3;
          test_case_fs_sn.m_component_goten = 0;
          test_case_fs_sn.m_int_goten._0_1_ = 1;
          test_case_fs_sn.m_int_goten._4_4_ = 5;
          test_case_fs_sn._32_8_ = *(undefined8 *)local_20;
          test_case_fs_sn.m_type_gohan.m_basic_type = local_20->m_n_rows;
          test_case_fs_sn.m_type_gohan.m_n_columns = local_50->m_basic_type;
          test_case_fs_sn.m_type_gohan.m_n_rows = local_50->m_n_columns;
          test_case_fs_sn.m_type_goten.m_basic_type = local_50->m_n_rows;
          test_case_fs_sc.m_type_goten.m_n_columns = 0;
          test_case_fs_cs.m_component_gohan = 2;
          test_case_fs_cs.m_component_goten = 3;
          test_case_fs_cs.m_int_goten._0_1_ = 1;
          test_case_fs_cs.m_int_goten._4_4_ = 5;
          test_case_fs_cs._32_8_ = *(undefined8 *)local_20;
          test_case_fs_cs.m_type_gohan.m_basic_type = local_20->m_n_rows;
          test_case_fs_cs.m_type_gohan.m_n_columns = local_50->m_basic_type;
          test_case_fs_cs.m_type_gohan.m_n_rows = local_50->m_n_columns;
          test_case_fs_cs.m_type_goten.m_basic_type = local_50->m_n_rows;
          local_318._0_4_ = 0;
          test_case_fs_sc.m_component_gohan = 3;
          test_case_fs_sc.m_component_goten = 2;
          test_case_fs_sc.m_int_goten._0_1_ = 1;
          test_case_fs_sc.m_int_goten._4_4_ = 5;
          test_case_fs_sc._32_8_ = *(undefined8 *)local_20;
          test_case_fs_sc.m_type_gohan.m_basic_type = local_20->m_n_rows;
          test_case_fs_sc.m_type_gohan.m_n_columns = local_50->m_basic_type;
          test_case_fs_sc.m_type_gohan.m_n_rows = local_50->m_n_columns;
          test_case_fs_sc.m_type_goten.m_basic_type = local_50->m_n_rows;
          local_318._4_4_ = GVar2;
          test_case_fs_sc._8_8_ = pcVar5;
          test_case_fs_sc.m_int_gohan = pcVar6;
          test_case_fs_sc.m_type_goten.m_n_rows = GVar2;
          test_case_fs_cs._8_8_ = pcVar5;
          test_case_fs_cs.m_int_gohan = pcVar6;
          test_case_fs_cs.m_type_goten.m_n_rows = GVar2;
          test_case_fs_sn._8_8_ = pcVar5;
          test_case_fs_sn.m_int_gohan = pcVar6;
          test_case_fs_sn.m_type_goten.m_n_rows = GVar2;
          test_case_fs_ns._8_8_ = pcVar5;
          test_case_fs_ns.m_int_gohan = pcVar6;
          test_case_fs_ns.m_type_goten.m_n_rows = GVar2;
          test_case_fs_cn._8_8_ = pcVar5;
          test_case_fs_cn.m_int_gohan = pcVar6;
          test_case_fs_cn.m_type_goten.m_n_rows = GVar2;
          test_case_fs_nc._8_8_ = pcVar5;
          test_case_fs_nc.m_int_gohan = pcVar6;
          test_case_fs_nc.m_type_goten.m_n_rows = GVar2;
          test_case_tes_pn.m_type_goten.m_n_rows = GVar2;
          test_case_tes_np.m_type_goten.m_n_rows = GVar2;
          test_case_tcs_pn.m_type_goten.m_n_rows = GVar2;
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_tcs_pn.m_type_goten.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_tes_np.m_type_goten.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_tes_pn.m_type_goten.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_fs_nc.m_type_goten.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_fs_cn.m_type_goten.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_fs_ns.m_type_goten.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_fs_sn.m_type_goten.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_fs_cs.m_type_goten.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&test_case_fs_sc.m_type_goten.m_n_columns);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)local_318);
        }
      }
    }
  }
  return;
}

Assistant:

void VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type_gohan		   = getType(i);
		const bool		   is_float_type_gohan = isFloatType(type_gohan);

		/* Skip matrices */
		if (1 != type_gohan.m_n_columns)
		{
			continue;
		}

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& type_goten		   = getType(j);
			const bool		   is_flat_req_gohan   = (Utils::Type::Float == type_gohan.m_basic_type) ? false : true;
			const bool		   is_flat_req_goten   = (Utils::Type::Float == type_goten.m_basic_type) ? false : true;
			const bool		   is_float_type_goten = isFloatType(type_goten);

			/* Skip matrices */
			if (1 != type_goten.m_n_columns)
			{
				continue;
			}

			/* Skip invalid combinations */
			if (is_float_type_gohan != is_float_type_goten)
			{
				continue;
			}

			const GLuint n_req_components_gohan = type_gohan.m_n_rows;
			const GLuint n_req_components_goten = type_goten.m_n_rows;

			/* Skip pairs that cannot fit into one location */
			if (n_components_per_location < (n_req_components_gohan + n_req_components_goten))
			{
				continue;
			}

			const GLuint gohan = 0;
			const GLuint goten = gohan + n_req_components_gohan;

			const GLchar* fs_int_gohan = is_flat_req_gohan ? "flat" : "";
			const GLchar* fs_int_goten = is_flat_req_goten ? "flat" : "";

			testCase test_case_tcs_np = { gohan,	  goten,	 NONE, PATCH, "", "", false, Utils::Shader::TESS_CTRL,
										  type_gohan, type_goten };

			testCase test_case_tcs_pn = { gohan,	  goten,	 PATCH, NONE, "", "", false, Utils::Shader::TESS_CTRL,
										  type_gohan, type_goten };

			testCase test_case_tes_np = { gohan,	  goten,	 NONE, PATCH, "", "", true, Utils::Shader::TESS_EVAL,
										  type_gohan, type_goten };

			testCase test_case_tes_pn = { gohan,	  goten,	 PATCH, NONE, "", "", true, Utils::Shader::TESS_EVAL,
										  type_gohan, type_goten };

			testCase test_case_fs_nc = { gohan,		   goten,		 NONE, CENTROID,
										 fs_int_gohan, fs_int_goten, true, Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_cn = { gohan,		   goten,		 CENTROID, NONE,
										 fs_int_gohan, fs_int_goten, true,	 Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_ns = { gohan,		   goten,		 NONE, SAMPLE,
										 fs_int_gohan, fs_int_goten, true, Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_sn = { gohan,		   goten,		 SAMPLE, NONE,
										 fs_int_gohan, fs_int_goten, true,   Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_cs = { gohan,		   goten,		 CENTROID, SAMPLE,
										 fs_int_gohan, fs_int_goten, true,	 Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_sc = { gohan,		   goten,		 SAMPLE, CENTROID,
										 fs_int_gohan, fs_int_goten, true,   Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			m_test_cases.push_back(test_case_tcs_np);
			m_test_cases.push_back(test_case_tcs_pn);
			m_test_cases.push_back(test_case_tes_np);
			m_test_cases.push_back(test_case_tes_pn);
			m_test_cases.push_back(test_case_fs_nc);
			m_test_cases.push_back(test_case_fs_cn);
			m_test_cases.push_back(test_case_fs_ns);
			m_test_cases.push_back(test_case_fs_sn);
			m_test_cases.push_back(test_case_fs_cs);
			m_test_cases.push_back(test_case_fs_sc);
		}
	}
}